

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

int pushXFStack(xformDatabase *xdb,matrix4 *ctm)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  
  uVar1 = xdb->nstack;
  iVar2 = 0;
  if (uVar1 - 1 < 7) {
    xdb->nstack = uVar1 + 1;
    pdVar4 = (double *)xdb->ctmstack[uVar1];
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar4 = *(double *)ctm;
      ctm = (matrix4 *)((long)ctm + 8);
      pdVar4 = pdVar4 + 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int pushXFStack(xformDatabase* xdb, matrix4* ctm) {
   if (xdb->nstack > 0 && xdb->nstack < MAX_XFORM_STACK_DEPTH) {
      xdb->nstack++;
      *(xdb->ctmstack[xdb->nstack - 1]) = *ctm;
      return TRUE;
   }
   else {
      return FALSE;
   }
}